

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int AnalyzeScanDataResponseRPLIDAR
              (uchar *buf,int buflen,BOOL *pbNewScan,int *pQuality,double *pAngle,double *pDistance,
              int *pnbBytesToRequest,int *pnbBytesToDiscard)

{
  ushort uVar1;
  double dVar2;
  unsigned_short distance_q2;
  unsigned_short angle_q6;
  double *pDistance_local;
  double *pAngle_local;
  int *pQuality_local;
  BOOL *pbNewScan_local;
  int buflen_local;
  uchar *buf_local;
  
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (buflen < 5) {
    *pnbBytesToRequest = 5 - buflen;
    buf_local._4_4_ = 6;
  }
  else {
    *pbNewScan = *buf & 1;
    if (*pbNewScan == (int)(*buf & 2) >> 1) {
      printf("Warning : RPLIDAR bad inversed start bit. \n");
      *pnbBytesToDiscard = 1;
      buf_local._4_4_ = 1;
    }
    else if ((buf[1] & 1) == 1) {
      *pQuality = (int)(uint)*buf >> 2;
      uVar1 = *(ushort *)(buf + 3);
      dVar2 = fmod_2PI_deg2rad((double)(int)-(uint)(ushort)((ushort)buf[2] << 7 |
                                                           (ushort)((int)(uint)buf[1] >> 1)) / 64.0)
      ;
      *pAngle = dVar2;
      *pDistance = (double)uVar1 / 4000.0;
      buf_local._4_4_ = 0;
    }
    else {
      printf("Warning : RPLIDAR bad check bit. \n");
      *pnbBytesToDiscard = 1;
      buf_local._4_4_ = 1;
    }
  }
  return buf_local._4_4_;
}

Assistant:

inline int AnalyzeScanDataResponseRPLIDAR(unsigned char* buf, int buflen, BOOL* pbNewScan, int* pQuality, double* pAngle, double* pDistance,
	int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	unsigned short angle_q6 = 0;
	unsigned short distance_q2 = 0;

	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR)
	{
		*pnbBytesToRequest = NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	*pbNewScan = (buf[0] & START_BIT_MASK_SCAN_DATA_RESPONSE_RPLIDAR);
	if (*pbNewScan == ((buf[0] & INVERTED_START_BIT_MASK_SCAN_DATA_RESPONSE_RPLIDAR) >> 1))
	{
		printf("Warning : RPLIDAR bad inversed start bit. \n");
		*pnbBytesToDiscard = 1; // We are only sure that the first byte can be discarded...
		return EXIT_FAILURE;
	}
	if ((buf[1] & CHECK_BIT_MASK_SCAN_DATA_RESPONSE_RPLIDAR) != 1)
	{
		printf("Warning : RPLIDAR bad check bit. \n");
		*pnbBytesToDiscard = 1; // We are only sure that the first byte can be discarded...
		return EXIT_FAILURE;
	}
	*pQuality = (unsigned char)(buf[0] >> 2);
	angle_q6 = (buf[2] << 7)|(buf[1] >> 1);
	distance_q2 = (buf[4] << 8)|buf[3];
	// Convert in rad.
	*pAngle = fmod_2PI_deg2rad(-angle_q6/64.0);
	// Convert in m.
	*pDistance = distance_q2/4000.0;

	return EXIT_SUCCESS;
}